

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall QtPromisePrivate::PromiseError::PromiseError<int>(PromiseError *this,int *value)

{
  int *piVar1;
  int *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  piVar1 = (int *)__cxa_allocate_exception(4);
  *piVar1 = *value;
  __cxa_throw(piVar1,&int::typeinfo,0);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }